

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sym.h
# Opt level: O3

void GlobOpt::TrackByteCodeSymUsed
               (StackSym *sym,BVSparse<Memory::JitArenaAllocator> *instrByteCodeStackSymUsed)

{
  if ((*(uint *)&sym->field_0x18 >> 0xd & 1) == 0) {
    return;
  }
  if ((*(uint *)&sym->field_0x18 >> 0x10 & 1) != 0) {
    sym = StackSym::GetVarEquivSym(sym,(Func *)0x0);
  }
  BVSparse<Memory::JitArenaAllocator>::Set(instrByteCodeStackSymUsed,(sym->super_Sym).m_id);
  return;
}

Assistant:

bool            HasByteCodeRegSlot() const { return m_hasByteCodeRegSlot; }